

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void Catch::Clara::addOptName(Arg *arg,string *optName)

{
  string *__rhs;
  ulong uVar1;
  ulong uVar2;
  size_type sVar3;
  int iVar4;
  logic_error *plVar5;
  long *plVar6;
  size_type *psVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  _Alloc_hider _Var9;
  bool bVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  long *local_b0;
  size_t local_a8;
  long local_a0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  ulong local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (optName->_M_string_length != 0) {
    local_70 = &local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"--","");
    uVar2 = local_68;
    uVar1 = optName->_M_string_length;
    if ((uVar1 < local_68) ||
       (std::__cxx11::string::substr((ulong)&local_b0,(ulong)optName), local_a8 != local_68)) {
      bVar10 = false;
    }
    else if (local_a8 == 0) {
      bVar10 = true;
    }
    else {
      iVar4 = bcmp(local_b0,local_70,local_a8);
      bVar10 = iVar4 == 0;
    }
    if ((uVar2 <= uVar1) && (local_b0 != local_a0)) {
      operator_delete(local_b0,local_a0[0] + 1);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60._M_allocated_capacity + 1);
    }
    if (bVar10) {
      __rhs = &(arg->super_OptionArgProperties).longName;
      if ((arg->super_OptionArgProperties).longName._M_string_length != 0) {
        plVar5 = (logic_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_d0,"Only one long opt may be specified. \'",__rhs);
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_d0);
        local_90._M_dataplus._M_p = (pointer)*plVar6;
        psVar7 = (size_type *)(plVar6 + 2);
        if ((size_type *)local_90._M_dataplus._M_p == psVar7) {
          local_90.field_2._M_allocated_capacity = *psVar7;
          local_90.field_2._8_8_ = plVar6[3];
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        }
        else {
          local_90.field_2._M_allocated_capacity = *psVar7;
        }
        local_90._M_string_length = plVar6[1];
        *plVar6 = (long)psVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::operator+(&local_50,&local_90,optName);
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
        local_70 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*plVar6;
        paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(plVar6 + 2);
        if (local_70 == paVar8) {
          local_60._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_60._8_8_ = plVar6[3];
          local_70 = &local_60;
        }
        else {
          local_60._M_allocated_capacity = paVar8->_M_allocated_capacity;
        }
        local_68 = plVar6[1];
        *plVar6 = (long)paVar8;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::logic_error::logic_error(plVar5,(string *)&local_70);
        __cxa_throw(plVar5,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      std::__cxx11::string::substr((ulong)&local_70,(ulong)optName);
      std::__cxx11::string::operator=((string *)__rhs,(string *)&local_70);
      local_50.field_2._M_allocated_capacity = local_60._M_allocated_capacity;
      _Var9._M_p = (pointer)local_70;
      if (local_70 == &local_60) {
        return;
      }
    }
    else {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"-","");
      sVar3 = local_50._M_string_length;
      uVar1 = optName->_M_string_length;
      if ((uVar1 < local_50._M_string_length) ||
         (std::__cxx11::string::substr((ulong)&local_70,(ulong)optName),
         local_68 != local_50._M_string_length)) {
        bVar10 = false;
      }
      else if (local_68 == 0) {
        bVar10 = true;
      }
      else {
        iVar4 = bcmp(local_70,local_50._M_dataplus._M_p,local_68);
        bVar10 = iVar4 == 0;
      }
      if ((sVar3 <= uVar1) && (local_70 != &local_60)) {
        operator_delete(local_70,local_60._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (!bVar10) {
        plVar5 = (logic_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_90,"option must begin with - or --. Option was: \'",optName);
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_90);
        local_50._M_dataplus._M_p = (pointer)*plVar6;
        psVar7 = (size_type *)(plVar6 + 2);
        if ((size_type *)local_50._M_dataplus._M_p == psVar7) {
          local_50.field_2._M_allocated_capacity = *psVar7;
          local_50.field_2._8_8_ = plVar6[3];
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        }
        else {
          local_50.field_2._M_allocated_capacity = *psVar7;
        }
        local_50._M_string_length = plVar6[1];
        *plVar6 = (long)psVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::logic_error::logic_error(plVar5,(string *)&local_50);
        __cxa_throw(plVar5,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      std::__cxx11::string::substr((ulong)&local_50,(ulong)optName);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &arg->super_OptionArgProperties,&local_50);
      _Var9._M_p = local_50._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p == &local_50.field_2) {
        return;
      }
    }
    operator_delete(_Var9._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void addOptName( Arg& arg, std::string const& optName )
        {
            if( optName.empty() )
                return;
            if( Detail::startsWith( optName, "--" ) ) {
                if( !arg.longName.empty() )
                    throw std::logic_error( "Only one long opt may be specified. '"
                        + arg.longName
                        + "' already specified, now attempting to add '"
                        + optName + "'" );
                arg.longName = optName.substr( 2 );
            }
            else if( Detail::startsWith( optName, "-" ) )
                arg.shortNames.push_back( optName.substr( 1 ) );
            else
                throw std::logic_error( "option must begin with - or --. Option was: '" + optName + "'" );
        }